

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

uint * __thiscall
wasm::ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
          (ZeroInitSmallVector<unsigned_int,_1UL> *this,size_t i)

{
  size_t sVar1;
  uint *puVar2;
  size_t i_local;
  ZeroInitSmallVector<unsigned_int,_1UL> *this_local;
  
  sVar1 = SmallVector<unsigned_int,_1UL>::size(&this->super_SmallVector<unsigned_int,_1UL>);
  if (sVar1 <= i) {
    resize(this,i + 1);
  }
  puVar2 = SmallVector<unsigned_int,_1UL>::operator[](&this->super_SmallVector<unsigned_int,_1UL>,i)
  ;
  return puVar2;
}

Assistant:

T& operator[](size_t i) {
    if (i >= this->size()) {
      resize(i + 1);
    }
    return SmallVector<T, N>::operator[](i);
  }